

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

int ImGui::DockNodeGetTabOrder(ImGuiWindow *window)

{
  ImGuiTabBar *tab_bar;
  ImGuiTabItem *pIVar1;
  int iVar2;
  
  tab_bar = window->DockNode->TabBar;
  iVar2 = -1;
  if (tab_bar != (ImGuiTabBar *)0x0) {
    pIVar1 = TabBarFindTabByID(tab_bar,window->ID);
    if (pIVar1 != (ImGuiTabItem *)0x0) {
      iVar2 = (int)((ulong)((long)pIVar1 - (long)(tab_bar->Tabs).Data) >> 3) * -0x33333333;
    }
  }
  return iVar2;
}

Assistant:

int ImGui::DockNodeGetTabOrder(ImGuiWindow* window)
{
    ImGuiTabBar* tab_bar = window->DockNode->TabBar;
    if (tab_bar == NULL)
        return -1;
    ImGuiTabItem* tab = TabBarFindTabByID(tab_bar, window->ID);
    return tab ? tab_bar->GetTabOrder(tab) : -1;
}